

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_mixer_chain.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  undefined8 *in_RSI;
  int in_EDI;
  float fVar4;
  char *filename;
  int i;
  float max_sample_time;
  float sample_time;
  ALLEGRO_SAMPLE *sample_data [2];
  ALLEGRO_SAMPLE_INSTANCE *sample [2];
  ALLEGRO_MIXER *submixer [2];
  ALLEGRO_MIXER *mixer;
  ALLEGRO_VOICE *voice;
  int local_64;
  float local_60;
  long alStack_58 [4];
  long local_38;
  long local_30;
  long local_20;
  long local_18;
  undefined8 *local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  if (local_8 < 3) {
    log_printf("This example needs to be run from the command line.\nUsage: %s file1 file2\n",
               *local_10);
  }
  else {
    al_init_acodec_addon();
    uVar2 = al_install_audio();
    if ((uVar2 & 1) == 0) {
      abort_example("Could not init sound!\n");
    }
    local_18 = al_create_voice(0xac44,1,0x20);
    if (local_18 == 0) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
    }
    local_20 = al_create_mixer(0xac44,3,0x20);
    local_38 = al_create_mixer(0xac44,3,0x20);
    local_30 = al_create_mixer(0xac44,3,0x20);
    if (((local_20 == 0) || (local_38 == 0)) || (local_30 == 0)) {
      abort_example("al_create_mixer failed.\n");
    }
    uVar2 = al_attach_mixer_to_voice(local_20,local_18);
    if ((uVar2 & 1) == 0) {
      abort_example("al_attach_mixer_to_voice failed.\n");
    }
    for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
      uVar1 = local_10[local_64 + 1];
      lVar3 = al_load_sample(uVar1);
      alStack_58[local_64] = lVar3;
      if (alStack_58[local_64] == 0) {
        abort_example("Could not load sample from \'%s\'!\n",uVar1);
      }
      lVar3 = al_create_sample_instance(0);
      alStack_58[(long)local_64 + 2] = lVar3;
      if (alStack_58[(long)local_64 + 2] == 0) {
        abort_example("al_create_sample failed.\n");
      }
      uVar2 = al_set_sample(alStack_58[(long)local_64 + 2],alStack_58[local_64]);
      if ((uVar2 & 1) == 0) {
        abort_example("al_set_sample_ptr failed.\n");
      }
      uVar2 = al_attach_sample_instance_to_mixer
                        (alStack_58[(long)local_64 + 2],alStack_58[(long)local_64 + 4]);
      if ((uVar2 & 1) == 0) {
        abort_example("al_attach_sample_instance_to_mixer failed.\n");
      }
      uVar2 = al_attach_mixer_to_mixer(alStack_58[(long)local_64 + 4],local_20);
      if ((uVar2 & 1) == 0) {
        abort_example("al_attach_mixer_to_mixer failed.\n");
      }
    }
    for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
      al_set_sample_instance_playmode(alStack_58[(long)local_64 + 2],0x101);
      al_play_sample_instance(alStack_58[(long)local_64 + 2]);
    }
    local_60 = (float)al_get_sample_instance_time(alStack_58[2]);
    fVar4 = (float)al_get_sample_instance_time(alStack_58[3]);
    if (local_60 < fVar4) {
      local_60 = fVar4;
    }
    log_printf("Playing...");
    al_rest((double)local_60);
    al_set_sample_instance_gain(0x3f000000,alStack_58[2]);
    al_rest((double)local_60);
    al_set_sample_instance_gain(0x3e800000,alStack_58[3]);
    al_rest((double)local_60);
    al_stop_sample_instance(alStack_58[2]);
    al_stop_sample_instance(alStack_58[3]);
    log_printf("Done\n");
    for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
      al_set_sample(alStack_58[(long)local_64 + 2],0);
      al_destroy_sample(alStack_58[local_64]);
      al_destroy_sample_instance(alStack_58[(long)local_64 + 2]);
      al_destroy_mixer(alStack_58[(long)local_64 + 4]);
    }
    al_destroy_mixer(local_20);
    al_destroy_voice(local_18);
    al_uninstall_audio();
  }
  close_log(true);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_VOICE *voice;
   ALLEGRO_MIXER *mixer;
   ALLEGRO_MIXER *submixer[2];
   ALLEGRO_SAMPLE_INSTANCE *sample[2];
   ALLEGRO_SAMPLE *sample_data[2];
   float sample_time;
   float max_sample_time;
   int i;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 3) {
      log_printf("This example needs to be run from the command line.\nUsage: %s file1 file2\n", argv[0]);
      goto done;
   }

   al_init_acodec_addon();

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   voice = al_create_voice(44100, ALLEGRO_AUDIO_DEPTH_INT16,
      ALLEGRO_CHANNEL_CONF_2);
   if (!voice) {
      abort_example("Could not create ALLEGRO_VOICE.\n");
   }

   mixer = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   submixer[0] = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   submixer[1] = al_create_mixer(44100, ALLEGRO_AUDIO_DEPTH_FLOAT32,
      ALLEGRO_CHANNEL_CONF_2);
   if (!mixer || !submixer[0] || !submixer[1]) {
      abort_example("al_create_mixer failed.\n");
   }

   if (!al_attach_mixer_to_voice(mixer, voice)) {
      abort_example("al_attach_mixer_to_voice failed.\n");
   }

   for (i = 0; i < 2; i++) {
      const char *filename = argv[i + 1];
      sample_data[i] = al_load_sample(filename);
      if (!sample_data[i]) {
         abort_example("Could not load sample from '%s'!\n", filename);
      }
      sample[i] = al_create_sample_instance(NULL);
      if (!sample[i]) {
         abort_example("al_create_sample failed.\n");
      }
      if (!al_set_sample(sample[i], sample_data[i])) {
         abort_example("al_set_sample_ptr failed.\n");
      }
      if (!al_attach_sample_instance_to_mixer(sample[i], submixer[i])) {
         abort_example("al_attach_sample_instance_to_mixer failed.\n");
      }
      if (!al_attach_mixer_to_mixer(submixer[i], mixer)) {
         abort_example("al_attach_mixer_to_mixer failed.\n");
      }
   }

   /* Play sample in looping mode. */
   for (i = 0; i < 2; i++) {
      al_set_sample_instance_playmode(sample[i], ALLEGRO_PLAYMODE_LOOP);
      al_play_sample_instance(sample[i]);
   }

   max_sample_time = al_get_sample_instance_time(sample[0]);
   sample_time = al_get_sample_instance_time(sample[1]);
   if (sample_time > max_sample_time)
      max_sample_time = sample_time;

   log_printf("Playing...");

   al_rest(max_sample_time);

   al_set_sample_instance_gain(sample[0], 0.5);
   al_rest(max_sample_time);

   al_set_sample_instance_gain(sample[1], 0.25);
   al_rest(max_sample_time);

   al_stop_sample_instance(sample[0]);
   al_stop_sample_instance(sample[1]);
   log_printf("Done\n");

   /* Free the memory allocated. */
   for (i = 0; i < 2; i++) {
      al_set_sample(sample[i], NULL);
      al_destroy_sample(sample_data[i]);
      al_destroy_sample_instance(sample[i]);
      al_destroy_mixer(submixer[i]);
   }
   al_destroy_mixer(mixer);
   al_destroy_voice(voice);

   al_uninstall_audio();

done:
   close_log(true);

   return 0;
}